

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_saver_success_example.cpp
# Opt level: O1

void foo1(int *a)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long *plVar4;
  
  iVar2 = std::uncaught_exceptions();
  iVar1 = *a;
  *a = 1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"foo1 a = ",9);
  plVar4 = (long *)std::ostream::operator<<((ostream *)&std::cout,*a);
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  std::ostream::flush();
  if (iVar2 != -1) {
    iVar3 = std::uncaught_exceptions();
    if (iVar3 <= iVar2) {
      *a = iVar1;
    }
  }
  return;
}

Assistant:

void foo1(int& a) {
  SAVER_SUCCESS(a); // State saver on success.

  a = 1;
  std::cout << "foo1 a = " << a << std::endl;
 // Original state will automatically restored, on scope leave when no exceptions have been thrown.
}